

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPSDESInfo::DeletePrivatePrefix(RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen)

{
  list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  *this_00;
  int iVar1;
  const_iterator __position;
  
  this_00 = &this->privitems;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      return -0x39;
    }
  } while ((__position._M_node[1]._M_next[2]._M_prev != (_List_node_base *)prefixlen) ||
          ((prefixlen != 0 &&
           (iVar1 = bcmp(prefix,__position._M_node[1]._M_next[2]._M_next,prefixlen), iVar1 != 0))));
  RTPDelete<jrtplib::RTCPSDESInfo::SDESPrivateItem>
            ((SDESPrivateItem *)__position._M_node[1]._M_next,(this->super_RTPMemoryObject).mgr);
  std::__cxx11::
  list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ::erase(this_00,__position);
  return 0;
}

Assistant:

int RTCPSDESInfo::DeletePrivatePrefix(const uint8_t *prefix,size_t prefixlen)
{
	std::list<SDESPrivateItem *>::iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (!found)
		return ERR_RTP_SDES_PREFIXNOTFOUND;
	
	RTPDelete(*it,GetMemoryManager());
	privitems.erase(it);
	return 0;
}